

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_write_resp_hds(Curl_easy *data,char *buf,size_t blen,size_t *pconsumed)

{
  dynbuf *s;
  undefined1 *puVar1;
  uint uVar2;
  connectdata *pcVar3;
  bool bVar4;
  CURLcode CVar5;
  statusline sVar6;
  void *pvVar7;
  size_t sVar8;
  char *pcVar9;
  CURLcode unaff_EBP;
  char cVar10;
  size_t local_40;
  connectdata *local_38;
  
  if (((data->req).field_0xd9 & 1) == 0) {
    *pconsumed = 0;
    unaff_EBP = CURLE_OK;
  }
  else {
    local_38 = data->conn;
    *pconsumed = 0;
    s = &(data->state).headerb;
    bVar4 = false;
    do {
      if ((blen == 0) || (((data->req).field_0xd9 & 1) == 0)) goto LAB_001380d9;
      pvVar7 = memchr(buf,10,blen);
      if (pvVar7 == (void *)0x0) {
        CVar5 = Curl_dyn_addn(s,buf,blen);
        cVar10 = '\x01';
        if (CVar5 != CURLE_OK) goto LAB_00137ea0;
        *pconsumed = *pconsumed + blen;
        if ((data->req).headerline == 0) {
          pcVar9 = Curl_dyn_ptr(s);
          sVar8 = Curl_dyn_len(s);
          pcVar3 = local_38;
          sVar6 = checkprotoprefix(data,local_38,pcVar9,sVar8);
          if (sVar6 == STATUS_BAD) {
            puVar1 = &(data->req).field_0xd9;
            *puVar1 = *puVar1 & 0xfe;
            Curl_conncontrol(pcVar3,2);
            if (pcVar3->httpversion < 10) {
              if (((data->set).field_0x8d0 & 0x10) != 0) {
                bVar4 = true;
                goto LAB_00137f4e;
              }
              Curl_failf(data,"Received HTTP/0.9 when not allowed");
              cVar10 = '\x01';
              unaff_EBP = CURLE_UNSUPPORTED_PROTOCOL;
            }
            else {
              Curl_failf(data,"Invalid status line");
              unaff_EBP = CURLE_WEIRD_SERVER_REPLY;
            }
          }
          else {
            cVar10 = '\x04';
          }
        }
        else {
LAB_00137f4e:
          cVar10 = '\x04';
        }
      }
      else {
        local_40 = (long)pvVar7 + (1 - (long)buf);
        CVar5 = Curl_dyn_addn(s,buf,local_40);
        if (CVar5 == CURLE_OK) {
          *pconsumed = *pconsumed + local_40;
          blen = blen - local_40;
          buf = buf + local_40;
          if ((data->req).headerline == 0) {
            pcVar9 = Curl_dyn_ptr(s);
            sVar8 = Curl_dyn_len(s);
            pcVar3 = local_38;
            sVar6 = checkprotoprefix(data,local_38,pcVar9,sVar8);
            cVar10 = '\0';
            if (sVar6 == STATUS_BAD) {
              Curl_conncontrol(pcVar3,2);
              if (pcVar3->httpversion < 10) {
                if (((data->set).field_0x8d0 & 0x10) == 0) {
                  Curl_failf(data,"Received HTTP/0.9 when not allowed");
                  cVar10 = '\x01';
                  unaff_EBP = CURLE_UNSUPPORTED_PROTOCOL;
                }
                else {
                  puVar1 = &(data->req).field_0xd9;
                  *puVar1 = *puVar1 & 0xfe;
                  cVar10 = '\x04';
                  bVar4 = true;
                }
              }
              else {
                Curl_failf(data,"Invalid status line");
                unaff_EBP = CURLE_WEIRD_SERVER_REPLY;
                cVar10 = '\x01';
              }
            }
            if (sVar6 == STATUS_BAD) goto LAB_0013803e;
          }
          pcVar9 = Curl_dyn_ptr(s);
          sVar8 = Curl_dyn_len(s);
          CVar5 = http_rw_hd(data,pcVar9,sVar8,buf,blen,&local_40);
          Curl_dyn_reset(s);
          if (local_40 != 0) {
            blen = blen - local_40;
            buf = buf + local_40;
            *pconsumed = *pconsumed + local_40;
          }
          cVar10 = CVar5 != CURLE_OK;
          if ((bool)cVar10) {
            unaff_EBP = CVar5;
          }
          goto LAB_0013803e;
        }
LAB_00137ea0:
        cVar10 = '\x01';
        unaff_EBP = CVar5;
      }
LAB_0013803e:
    } while (cVar10 == '\0');
    if (cVar10 == '\x04') {
LAB_001380d9:
      unaff_EBP = CURLE_OK;
      if ((((data->req).field_0xd9 & 1) == 0) && (!bVar4)) {
        Curl_dyn_free(s);
      }
    }
    if (unaff_EBP == CURLE_OK) {
      uVar2 = *(uint *)&(data->req).field_0xd9;
      unaff_EBP = CURLE_OK;
      if ((uVar2 & 1) == 0) {
        unaff_EBP = CURLE_OK;
        if (((uVar2 >> 0x11 & 1) == 0) && (sVar8 = Curl_dyn_len(s), sVar8 != 0)) {
          pcVar9 = Curl_dyn_ptr(s);
          sVar8 = Curl_dyn_len(s);
          unaff_EBP = Curl_client_write(data,1,pcVar9,sVar8);
        }
        Curl_dyn_free(s);
      }
    }
  }
  return unaff_EBP;
}

Assistant:

CURLcode Curl_http_write_resp_hds(struct Curl_easy *data,
                                  const char *buf, size_t blen,
                                  size_t *pconsumed)
{
  if(!data->req.header) {
    *pconsumed = 0;
    return CURLE_OK;
  }
  else {
    CURLcode result;

    result = http_parse_headers(data, buf, blen, pconsumed);
    if(!result && !data->req.header) {
      if(!data->req.no_body && Curl_dyn_len(&data->state.headerb)) {
        /* leftover from parsing something that turned out not
         * to be a header, only happens if we allow for
         * HTTP/0.9 like responses */
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   Curl_dyn_ptr(&data->state.headerb),
                                   Curl_dyn_len(&data->state.headerb));
      }
      Curl_dyn_free(&data->state.headerb);
    }
    return result;
  }
}